

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Vec_Ptr_t * Aig_ManRegPartitionTraverse(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      *(int *)((long)pVVar4->pArray[lVar3] + 0x28) = (int)lVar3;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCis;
    } while (lVar3 < pVVar4->nSize);
  }
  iVar1 = p->nRegs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  uVar12 = 0;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  Aig_ManIncrementTravId(p);
  uVar10 = p->nRegs;
  uVar8 = p->nObjs[3] - uVar10;
  pVVar6 = p->vCos;
  if ((int)uVar8 < pVVar6->nSize) {
    uVar11 = (ulong)uVar8;
    uVar9 = 1;
    uVar10 = 0;
    do {
      if ((int)uVar8 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar6->pArray[uVar11];
      printf("Latch %d: ",(ulong)uVar9);
      Aig_ManRegPartitionTraverse_rec
                (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),pVVar4);
      uVar12 = pVVar4->nSize;
      printf("%d=%d \n",(ulong)uVar9,(ulong)(uVar12 - uVar10));
      uVar11 = uVar11 + 1;
      pVVar6 = p->vCos;
      uVar9 = uVar9 + 1;
      uVar10 = uVar12;
    } while ((int)uVar11 < pVVar6->nSize);
    uVar10 = p->nRegs;
  }
  printf("Total collected = %d. Total regs = %d.\n",(ulong)uVar12,(ulong)uVar10);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionTraverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vLos;
    Aig_Obj_t * pObj;
    int i, nPrev, Counter;
    // mark the registers
    Aig_ManForEachCi( p, pObj, i )
       pObj->iData = i; 
    // collect registers
    vLos = Vec_PtrAlloc( Aig_ManRegNum(p) );
    nPrev = 0;
    Counter = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        ++Counter;
        printf( "Latch %d: ", Counter );
        Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
printf( "%d=%d \n", Counter, Vec_PtrSize(vLos)-nPrev );
        nPrev = Vec_PtrSize(vLos);
    }
    printf( "Total collected = %d. Total regs = %d.\n", Vec_PtrSize(vLos), Aig_ManRegNum(p) );
    return vLos;
}